

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::AssignStmt::AssignStmt
          (AssignStmt *this,shared_ptr<kratos::Var> *left,shared_ptr<kratos::Var> *right)

{
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  AssignStmt(this,left,(shared_ptr<kratos::Var> *)&local_30,Undefined);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

AssignStmt::AssignStmt(const std::shared_ptr<Var> &left, const std::shared_ptr<Var> &right)
    : AssignStmt(left, right, AssignmentType::Undefined) {}